

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O3

void __thiscall
Js::FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData
          (FunctionCodeGenRuntimeData *this,FunctionBody *functionBody)

{
  Memory::Recycler::WBSetBit((char *)this);
  (this->functionBody).ptr = functionBody;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->clonedInlineCaches).inlineCaches.ptr = (WriteBarrierPtr<Js::InlineCache> *)0x0;
  (this->clonedInlineCaches).inlineCacheCount = 0;
  (this->inlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0;
  (this->ldFldInlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0;
  (this->callbackInlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0;
  (this->callApplyTargetInlinees).ptr = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0;
  (this->next).ptr = (FunctionCodeGenRuntimeData *)0x0;
  return;
}

Assistant:

FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData(FunctionBody *const functionBody)
        : functionBody(functionBody), inlinees(nullptr), next(nullptr)
    {
    }